

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.h
# Opt level: O0

void bandit::describe(char *desc,voidfunc_t *func)

{
  listener *listener;
  contextstack_t *context_stack;
  function<void_()> local_38;
  voidfunc_t *local_18;
  voidfunc_t *func_local;
  char *desc_local;
  
  local_18 = func;
  func_local = (voidfunc_t *)desc;
  std::function<void_()>::function(&local_38,func);
  listener = detail::registered_listener((listener *)0x0);
  context_stack = detail::context_stack();
  describe(desc,&local_38,listener,context_stack,false);
  std::function<void_()>::~function(&local_38);
  return;
}

Assistant:

inline void describe(const char* desc, detail::voidfunc_t func)
  {
    describe(desc, func, detail::registered_listener(), detail::context_stack());
  }